

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

ShellCommandHandler * __thiscall
llbuild::buildsystem::BuildSystem::resolveShellCommandHandler
          (BuildSystem *this,ShellCommand *command)

{
  StringMapImpl *this_00;
  void *pvVar1;
  StringRef *pSVar2;
  char *pcVar3;
  size_t sVar4;
  long *plVar5;
  StringRef path;
  StringRef Key;
  StringRef Key_00;
  ShellCommandHandler *pSVar6;
  ShellCommandHandler *pSVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  BuildSystemExtension *pBVar9;
  pair<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>,_bool>
  pVar10;
  ShellCommandHandler *local_30;
  
  pvVar1 = this->impl;
  iVar8 = (*(command->super_ExternalCommand).super_Command.super_JobDescriptor._vptr_JobDescriptor
            [0x1c])(command);
  if (*(long *)CONCAT44(extraout_var,iVar8) != ((long *)CONCAT44(extraout_var,iVar8))[1]) {
    iVar8 = (*(command->super_ExternalCommand).super_Command.super_JobDescriptor._vptr_JobDescriptor
              [0x1c])(command);
    pSVar2 = *(StringRef **)CONCAT44(extraout_var_00,iVar8);
    pcVar3 = pSVar2->Data;
    sVar4 = pSVar2->Length;
    Key_00 = *pSVar2;
    Key = *pSVar2;
    path = *pSVar2;
    this_00 = (StringMapImpl *)((long)pvVar1 + 0x118);
    iVar8 = llvm::StringMapImpl::FindKey(this_00,*pSVar2);
    if ((iVar8 != -1) && ((long)iVar8 != (ulong)*(uint *)((long)pvVar1 + 0x120))) {
      return (ShellCommandHandler *)this_00->TheTable[iVar8][1].StrLen;
    }
    pBVar9 = BuildSystemExtensionManager::lookupByCommandPath(&extensionManager,path);
    if (pBVar9 != (BuildSystemExtension *)0x0) {
      (*pBVar9->_vptr_BuildSystemExtension[2])(&local_30,pBVar9,pcVar3,sVar4);
      pSVar6 = local_30;
      pVar10 = llvm::
               StringMap<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>,_llvm::MallocAllocator>
               ::try_emplace<>((StringMap<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>,_llvm::MallocAllocator>
                                *)this_00,Key);
      pSVar7 = local_30;
      local_30 = (ShellCommandHandler *)0x0;
      plVar5 = *(long **)(*(long *)pVar10.first.
                                   super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>_>
                                   .Ptr.
                                   super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>_>
                         + 8);
      *(ShellCommandHandler **)
       (*(long *)pVar10.first.
                 super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>_>
                 .Ptr.
                 super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>_>
       + 8) = pSVar7;
      if (plVar5 == (long *)0x0) {
        return pSVar6;
      }
      (**(code **)(*plVar5 + 8))();
      if (local_30 == (ShellCommandHandler *)0x0) {
        return pSVar6;
      }
      (*local_30->_vptr_ShellCommandHandler[1])();
      return pSVar6;
    }
    pVar10 = llvm::
             StringMap<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>,_llvm::MallocAllocator>
             ::try_emplace<>((StringMap<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>,_llvm::MallocAllocator>
                              *)this_00,Key_00);
    plVar5 = *(long **)(*(long *)pVar10.first.
                                 super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>_>
                                 .Ptr.
                                 super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>_>
                       + 8);
    *(undefined8 *)
     (*(long *)pVar10.first.
               super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>_>
               .Ptr.
               super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>_>
     + 8) = 0;
    if (plVar5 != (long *)0x0) {
      (**(code **)(*plVar5 + 8))();
    }
  }
  return (ShellCommandHandler *)0x0;
}

Assistant:

ShellCommandHandler*
BuildSystem::resolveShellCommandHandler(ShellCommand* command) {
  return static_cast<BuildSystemImpl*>(impl)->resolveShellCommandHandler(command);
}